

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng-bt.c
# Opt level: O1

int lell_pcapng_append_packet
              (lell_pcapng_handle *h,uint64_t ns,int8_t sigdbm,int8_t noisedbm,uint32_t refAA,
              lell_packet *pkt)

{
  int iVar1;
  PCAPNG_HANDLE *handle;
  uint uVar2;
  PCAPNG_RESULT PVar3;
  ulong uVar4;
  option_header local_f2;
  uint64_t local_ee;
  undefined8 uStack_e6;
  undefined8 uStack_de;
  undefined2 uStack_d6;
  undefined6 local_d4;
  undefined2 uStack_ce;
  undefined8 uStack_cc;
  undefined1 local_c4 [8];
  pcapng_le_packet pcapng_pkt;
  
  unique0x1000037a = (PCAPNG_HANDLE *)h;
  uVar2 = lell_packet_is_data(pkt);
  iVar1 = pkt->length;
  if (iVar1 + 9U < 0x4a) {
    pcapng_pkt.blk_header.captured_len._0_1_ = pkt->channel_k;
    pcapng_pkt.blk_header.captured_len._3_1_ = (undefined1)pkt->access_address_offenses;
    pcapng_pkt.le_ll_header._0_2_ =
         (ushort)(uVar2 == 0) * 0x10 + (ushort)(noisedbm < sigdbm) * 4 + 0x23;
    uVar2 = iVar1 + 0x3aU & 0xfc;
    local_c4._0_4_ = 6;
    pcapng_pkt.blk_header.block_type = 0;
    pcapng_pkt.blk_header.block_total_length = (uint32_t)(ns >> 0x20);
    pcapng_pkt.blk_header.timestamp_high = iVar1 + 0x13;
    pcapng_pkt.blk_header.interface_id = (uint32_t)ns;
    local_c4._4_4_ = uVar2;
    pcapng_pkt.blk_header.timestamp_low = pcapng_pkt.blk_header.timestamp_high;
    pcapng_pkt.blk_header.captured_len._1_1_ = sigdbm;
    pcapng_pkt.blk_header.captured_len._2_1_ = noisedbm;
    pcapng_pkt.blk_header.packet_len = refAA;
    memcpy(&pcapng_pkt.le_ll_header.noise_power,pkt,(ulong)(iVar1 + 9U));
    uVar4 = (ulong)(iVar1 + 0x3aU & 0xfffffffc);
    *(undefined4 *)((long)&uStack_cc + uVar4) = 0;
    *(uint *)((long)&uStack_cc + uVar4 + 4) = uVar2;
    handle = stack0xffffffffffffffb8;
    PVar3 = pcapng_append_packet(stack0xffffffffffffffb8,(enhanced_packet_block *)local_c4);
    if (PVar3 == PCAPNG_OK) {
      uVar2 = lell_packet_is_data(pkt);
      if ((uVar2 == 0) && (pkt->adv_type == '\x05')) {
        local_f2.option_code = 0xd380;
        local_f2.option_length = 0x2e;
        uStack_cc._6_2_ = *(undefined2 *)(pkt->symbols + 0x20);
        uStack_e6 = *(undefined8 *)pkt->symbols;
        uStack_de = *(undefined8 *)(pkt->symbols + 8);
        uStack_d6 = (undefined2)*(undefined8 *)(pkt->symbols + 0x10);
        local_d4 = (undefined6)((ulong)*(undefined8 *)(pkt->symbols + 0x10) >> 0x10);
        uStack_ce = (undefined2)*(undefined8 *)(pkt->symbols + 0x18);
        uStack_cc._0_6_ = (undefined6)((ulong)*(undefined8 *)(pkt->symbols + 0x18) >> 0x10);
        local_ee = ns;
        pcapng_append_interface_option(handle,&local_f2);
      }
    }
    return -PVar3;
  }
  __assert_fail("caplen <= LE_MAX_PAYLOAD",
                "/workspace/llm4binary/github/license_c_cmakelists/samyk[P]libbtbb/lib/src/pcapng-bt.c"
                ,0x1b4,
                "void assemble_pcapng_le_packet(pcapng_le_packet *, const uint32_t, const uint64_t, const uint32_t, const uint8_t, const int8_t, const int8_t, const uint8_t, const uint32_t, const uint16_t, const uint8_t *)"
               );
}

Assistant:

int
lell_pcapng_append_packet(lell_pcapng_handle * h, const uint64_t ns,
			  const int8_t sigdbm, const int8_t noisedbm,
			  const uint32_t refAA, const lell_packet *pkt)
{
	uint16_t flags = LE_DEWHITENED | LE_AA_OFFENSES_VALID |
		LE_SIGPOWER_VALID |
		((noisedbm < sigdbm) ? LE_NOISEPOWER_VALID : 0) |
		(lell_packet_is_data(pkt) ? 0 : LE_REF_AA_VALID);
	pcapng_le_packet pcapng_pkt;

	/* The extra 9 bytes added to the packet length are for:
	   4 bytes for Access Address
	   2 bytes for PDU header
	   3 bytes for CRC */
	assemble_pcapng_le_packet( &pcapng_pkt,
				   0,
				   ns,
				   9+pkt->length,
				   pkt->channel_k,
				   sigdbm,
				   noisedbm,
				   pkt->access_address_offenses,
				   refAA,
				   flags,
				   &pkt->symbols[0] );
	int retval = -append_le_packet( (PCAPNG_HANDLE *) h, &pcapng_pkt );
	if ((retval == 0) && !lell_packet_is_data(pkt) && (pkt->adv_type == CONNECT_REQ)) {
		(void) lell_pcapng_record_connect_req(h, ns, &pkt->symbols[0]);
	}
	return retval;
}